

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Core *core,string_view filtName)

{
  string_view filtName_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Filter *in_RSI;
  undefined8 *in_RDI;
  Core *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff48;
  long *plVar1;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  shared_ptr<helics::FilterOperations> *in_stack_ffffffffffffff58;
  Filter *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_40;
  InterfaceHandle local_3c [11];
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_3c[0].hid = 0;
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  InterfaceHandle::InterfaceHandle(local_3c);
  filtName_00._M_str._0_4_ = in_stack_ffffffffffffff50;
  filtName_00._M_len = in_stack_ffffffffffffff48;
  filtName_00._M_str._4_4_ = in_stack_ffffffffffffff54;
  Filter::Filter(in_RSI,in_stack_ffffffffffffff30,filtName_00,
                 (InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
  *in_RDI = &PTR__CloningFilter_0091e128;
  plVar1 = (long *)in_RDI[1];
  local_58 = local_10;
  uStack_50 = uStack_8;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
  local_40 = (**(code **)(*plVar1 + 0x1d0))
                       (plVar1,local_58,uStack_50,local_68._M_len,local_68._M_str);
  *(undefined4 *)(in_RDI + 2) = local_40;
  std::make_shared<helics::CloneFilterOperation>();
  std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::CloneFilterOperation,void>
            ((shared_ptr<helics::FilterOperations> *)
             CONCAT44(local_78._M_str._4_4_,local_78._M_str._0_4_),
             (shared_ptr<helics::CloneFilterOperation> *)
             CONCAT44(local_78._M_len._4_4_,(undefined4)local_78._M_len));
  Filter::setFilterOperations(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::shared_ptr<helics::FilterOperations>::~shared_ptr
            ((shared_ptr<helics::FilterOperations> *)0x2ca7fb);
  std::shared_ptr<helics::CloneFilterOperation>::~shared_ptr
            ((shared_ptr<helics::CloneFilterOperation> *)0x2ca805);
  return;
}

Assistant:

CloningFilter::CloningFilter(Core* core, std::string_view filtName):
    Filter(core, filtName, InterfaceHandle())
{
    handle = mCore->registerCloningFilter(filtName, std::string_view(), std::string_view());
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}